

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Brainfuck.h
# Opt level: O0

void __thiscall Brainfuck::Execute(Brainfuck *this,Interpreter *semantics)

{
  uint uVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  size_t sStack_28;
  uchar byte;
  size_t currentCommand;
  size_type commandCount;
  Interpreter *semantics_local;
  Brainfuck *this_local;
  
  sVar2 = std::vector<Brainfuck::CommandNode,_std::allocator<Brainfuck::CommandNode>_>::size
                    (&this->_commands);
  sVar3 = std::vector<Brainfuck::CommandNode,_std::allocator<Brainfuck::CommandNode>_>::size
                    (&this->_commands);
  if (sVar3 != 0) {
    for (sStack_28 = 0; sStack_28 < sVar2; sStack_28 = sStack_28 + 1) {
      pvVar4 = std::vector<Brainfuck::CommandNode,_std::allocator<Brainfuck::CommandNode>_>::
               operator[](&this->_commands,sStack_28);
      switch(pvVar4->command) {
      case Unknown:
        break;
      case IncrementPointer:
        (**semantics->_vptr_Interpreter)();
        break;
      case DecrementPointer:
        (*semantics->_vptr_Interpreter[1])();
        break;
      case IncrementData:
        (*semantics->_vptr_Interpreter[2])();
        break;
      case DecrementData:
        (*semantics->_vptr_Interpreter[3])();
        break;
      case WriteData:
        (*semantics->_vptr_Interpreter[5])();
        break;
      case ReadData:
        (*semantics->_vptr_Interpreter[4])();
        break;
      case JumpForward:
        uVar1 = (*semantics->_vptr_Interpreter[6])();
        if ((uVar1 & 1) != 0) {
          pvVar4 = std::vector<Brainfuck::CommandNode,_std::allocator<Brainfuck::CommandNode>_>::
                   operator[](&this->_commands,sStack_28);
          sStack_28 = pvVar4->matchingBracket;
        }
        break;
      case JumpBackward:
        uVar1 = (*semantics->_vptr_Interpreter[6])();
        if ((uVar1 & 1) == 0) {
          pvVar4 = std::vector<Brainfuck::CommandNode,_std::allocator<Brainfuck::CommandNode>_>::
                   operator[](&this->_commands,sStack_28);
          sStack_28 = pvVar4->matchingBracket;
        }
      }
    }
  }
  return;
}

Assistant:

void Execute(Interpreter & semantics)
    {
        auto commandCount = _commands.size();
        if (!_commands.size())
            return;

        for (size_t currentCommand = 0; currentCommand < commandCount; currentCommand++)
        {
            unsigned char byte;
            switch (_commands[currentCommand].command)
            {
                case Unknown: //unknown commands do nothing (this allows comments)
                    break;

                case IncrementPointer:
                    semantics.IncrementPointer();
                    break;

                case DecrementPointer:
                    semantics.DecrementPointer();
                    break;

                case IncrementData:
                    semantics.IncrementData();
                    break;

                case DecrementData:
                    semantics.DecrementData();
                    break;

                case WriteData:
                    semantics.WriteData();
                    break;

                case ReadData:
                    semantics.ReadData();
                    break;

                case JumpForward:
                    if (semantics.TestZero())
                        currentCommand = _commands[currentCommand].matchingBracket;
                    break;

                case JumpBackward:
                    if (!semantics.TestZero())
                        currentCommand = _commands[currentCommand].matchingBracket;
                    break;
            }
        }
    }